

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

bool __thiscall llvm::detail::DoubleAPFloat::isInteger(DoubleAPFloat *this)

{
  bool bVar1;
  
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1115,"bool llvm::detail::DoubleAPFloat::isInteger() const");
  }
  bVar1 = APFloat::isInteger((this->Floats)._M_t.
                             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                             .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl);
  if (bVar1) {
    bVar1 = APFloat::isInteger((this->Floats)._M_t.
                               super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                               .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
    return bVar1;
  }
  return false;
}

Assistant:

bool DoubleAPFloat::isInteger() const {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return Floats[0].isInteger() && Floats[1].isInteger();
}